

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::Model
          (Model *this,shared_ptr<fasttext::Matrix> *wi,shared_ptr<fasttext::Matrix> *wo,
          shared_ptr<fasttext::Loss> *loss,bool normalizeGradient)

{
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)this,
             &wi->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             &wo->super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->loss_).super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>,
             &loss->super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>);
  this->normalizeGradient_ = normalizeGradient;
  return;
}

Assistant:

Model::Model(
    std::shared_ptr<Matrix> wi,
    std::shared_ptr<Matrix> wo,
    std::shared_ptr<Loss> loss,
    bool normalizeGradient)
    : wi_(wi), wo_(wo), loss_(loss), normalizeGradient_(normalizeGradient) {}